

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.h
# Opt level: O0

Ref<anurbs::BrepEdge> __thiscall anurbs::Model::get<anurbs::BrepEdge>(Model *this,size_t index)

{
  const_reference pvVar1;
  size_type in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ref<anurbs::BrepEdge> RVar2;
  shared_ptr<anurbs::Entry<anurbs::BrepEdge>_> local_40;
  undefined1 local_30 [8];
  shared_ptr<anurbs::Entry<anurbs::BrepEdge>_> entry;
  size_t index_local;
  Model *this_local;
  
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(index + 0x18),in_RDX
                     );
  std::
  vector<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>::
  at((vector<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
      *)index,*pvVar1);
  std::static_pointer_cast<anurbs::Entry<anurbs::BrepEdge>,anurbs::EntryBase>
            ((shared_ptr<anurbs::EntryBase> *)local_30);
  std::shared_ptr<anurbs::Entry<anurbs::BrepEdge>_>::shared_ptr
            (&local_40,(shared_ptr<anurbs::Entry<anurbs::BrepEdge>_> *)local_30);
  Ref<anurbs::BrepEdge>::Ref((Ref<anurbs::BrepEdge> *)this,&local_40);
  std::shared_ptr<anurbs::Entry<anurbs::BrepEdge>_>::~shared_ptr(&local_40);
  std::shared_ptr<anurbs::Entry<anurbs::BrepEdge>_>::~shared_ptr
            ((shared_ptr<anurbs::Entry<anurbs::BrepEdge>_> *)local_30);
  RVar2.m_entry.super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  RVar2.m_entry.super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (Ref<anurbs::BrepEdge>)
         RVar2.m_entry.
         super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ref<TData> get(size_t index) const
    {
        const auto entry = std::static_pointer_cast<Entry<TData>>(
            m_entries.at(m_entry_map.at(index)));

        return Ref<TData>(entry);
    }